

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O3

int flush_data(byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t __n;
  
  iVar1 = 0;
  if (0 < (long)out_bit_idx) {
    lVar2 = bit_idx_to_byte_idx((long)out_bit_idx);
    iVar1 = get_available_bits((long)out_bit_idx);
    __n = (ulong)(iVar1 < 8) + lVar2;
    sVar3 = fwrite(output_buffer,1,__n,(FILE *)output_file_ptr);
    if (sVar3 == __n) {
      iVar1 = 0;
      if (is_first_byte == '\0') {
        first_byte_written = *output_buffer;
        is_first_byte = '\x01';
      }
    }
    else {
      perror("failed to write compressed file");
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int flush_data(byte_t *output_buffer, FILE* output_file_ptr) {
    if(out_bit_idx > 0) {
        long num_bytes_to_write = bit_idx_to_byte_idx(out_bit_idx);

        if (get_available_bits(out_bit_idx) < SYMBOL_BITS)
            num_bytes_to_write++;   // reserve the space for odd bits

#ifdef _DEBUG
        log_debug("flush_data", "out_bit_idx=%-8d num_bytes_to_write=%d\n", out_bit_idx, num_bytes_to_write);

        for (int i = 0; i < num_bytes_to_write; i++)
            log_trace_char_bin(output_buffer[i]);
#endif

        size_t bytesWritten = fwrite(output_buffer, sizeof(byte_t), num_bytes_to_write, output_file_ptr);
        if (bytesWritten != num_bytes_to_write) {
            perror("failed to write compressed file");
            return RC_FAIL;
        }

        if (is_first_byte) {
            first_byte_written = output_buffer[0];
            is_first_byte = false;
        }
    }
    return RC_OK;
}